

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O2

_Bool fy_node_mapping_contains_pair(fy_node *fyn_map,fy_node_pair *fynp)

{
  fy_node_pair *pfVar1;
  
  if ((fynp == (fy_node_pair *)0x0 || fyn_map == (fy_node *)0x0) || ((fyn_map->field_0x34 & 3) != 2)
     ) {
    return false;
  }
  if (fyn_map->xl == (fy_accel *)0x0) {
    pfVar1 = (fy_node_pair *)&fyn_map->field_12;
    do {
      pfVar1 = (fy_node_pair *)(pfVar1->node).next;
      if (pfVar1 == (fy_node_pair *)&fyn_map->field_12) {
        pfVar1 = (fy_node_pair *)0x0;
      }
      if (pfVar1 == (fy_node_pair *)0x0) {
        return false;
      }
    } while (pfVar1 != fynp);
  }
  else {
    pfVar1 = fy_node_accel_lookup_by_node(fyn_map,fynp->key);
    if (pfVar1 != fynp) {
      return false;
    }
  }
  return true;
}

Assistant:

bool fy_node_mapping_contains_pair(struct fy_node *fyn_map, struct fy_node_pair *fynp) {
    struct fy_node_pair *fynpi;

    if (!fyn_map || !fynp || fyn_map->type != FYNT_MAPPING)
        return false;

    if (fyn_map->xl) {
        fynpi = fy_node_accel_lookup_by_node(fyn_map, fynp->key);
        if (fynpi == fynp)
            return true;
    } else {
        for (fynpi = fy_node_pair_list_head(&fyn_map->mapping); fynpi; fynpi = fy_node_pair_next(&fyn_map->mapping,
                                                                                                 fynpi))
            if (fynpi == fynp)
                return true;
    }

    return false;
}